

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

Var Js::TypedArray<char,_false,_false>::Create
              (ArrayBufferBase *arrayBuffer,uint32 byteOffSet,uint32 mappedLength,
              JavascriptLibrary *javascriptLibrary)

{
  bool bVar1;
  uint uVar2;
  ScriptContext *scriptContext;
  Recycler *pRVar3;
  TypedArray<char,_false,_false> *this;
  TrackAllocData local_58;
  DynamicType *local_30;
  DynamicType *type;
  uint32 mappedByteLength;
  uint32 totalLength;
  JavascriptLibrary *javascriptLibrary_local;
  uint32 mappedLength_local;
  uint32 byteOffSet_local;
  ArrayBufferBase *arrayBuffer_local;
  
  _mappedByteLength = javascriptLibrary;
  javascriptLibrary_local._0_4_ = mappedLength;
  javascriptLibrary_local._4_4_ = byteOffSet;
  _mappedLength_local = arrayBuffer;
  bVar1 = UInt32Math::Mul(mappedLength,1,(uint32 *)&type);
  if (!bVar1) {
    bVar1 = UInt32Math::Add(javascriptLibrary_local._4_4_,(uint32)type,(uint32 *)((long)&type + 4));
    if (!bVar1) {
      uVar2 = (*(_mappedLength_local->super_DynamicObject).super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])();
      if (type._4_4_ <= uVar2) {
        local_30 = JavascriptLibrary::GetTypedArrayType<char,false>(_mappedByteLength,'\0');
        pRVar3 = JavascriptLibrary::GetRecycler(_mappedByteLength);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_58,(type_info *)&TypedArray<char,false,false>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                   ,0x298);
        pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
        this = (TypedArray<char,_false,_false> *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
        TypedArray(this,_mappedLength_local,javascriptLibrary_local._4_4_,
                   (uint32)javascriptLibrary_local,local_30);
        return this;
      }
    }
  }
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)_mappedLength_local);
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec24,(PCWSTR)0x0);
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::Create(ArrayBufferBase* arrayBuffer, uint32 byteOffSet, uint32 mappedLength, JavascriptLibrary* javascriptLibrary)
    {
        uint32 totalLength, mappedByteLength;

        if (UInt32Math::Mul(mappedLength, sizeof(TypeName), &mappedByteLength) ||
            UInt32Math::Add(byteOffSet, mappedByteLength, &totalLength) ||
            (totalLength > arrayBuffer->GetByteLength()))
        {
            JavascriptError::ThrowRangeError(arrayBuffer->GetScriptContext(), JSERR_InvalidTypedArrayLength);
        }

        DynamicType *type = javascriptLibrary->GetTypedArrayType<TypeName, clamped>(0);
        return RecyclerNew(javascriptLibrary->GetRecycler(), TypedArray, arrayBuffer, byteOffSet, mappedLength, type);
    }